

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionCosseratEasyRectangular::ChBeamSectionCosseratEasyRectangular
          (ChBeamSectionCosseratEasyRectangular *this,double width_y,double width_z,double E,
          double G,double density)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  double dVar2;
  shared_ptr<chrono::fea::ChElasticityCosseratSimple> melasticity;
  shared_ptr<chrono::fea::ChBeamSectionShapeRectangular> mdrawshape;
  undefined1 local_a9;
  double local_a8;
  double local_a0;
  double local_98;
  ChElasticityCosseratSimple *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  ChBeamSectionShapeRectangular *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  ChBeamSectionShapeRectangular *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  ChElasticityCosseratSimple *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_a8 = width_y;
  local_a0 = G;
  local_98 = width_z;
  local_70 = width_z;
  local_68 = width_y;
  local_60 = density;
  local_58 = E;
  ChBeamSection::ChBeamSection((ChBeamSection *)this);
  (this->super_ChBeamSectionCosserat).elasticity.
  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).elasticity.
  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).plasticity.
  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).plasticity.
  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).damping.
  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).damping.
  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).inertia.
  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).inertia.
  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).super_ChBeamSection._vptr_ChBeamSection =
       (_func_int **)&PTR__ChBeamSectionCosserat_00b25fa8;
  local_90 = (ChElasticityCosseratSimple *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChElasticityCosseratSimple,std::allocator<chrono::fea::ChElasticityCosseratSimple>>
            (&local_88,&local_90,(allocator<chrono::fea::ChElasticityCosseratSimple> *)&local_80);
  local_90->E = local_58;
  local_90->G = local_a0;
  (*(local_90->super_ChElasticityCosserat)._vptr_ChElasticityCosserat[4])(local_a8,local_98);
  local_30 = local_90;
  local_28._M_pi = local_88._M_pi;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
    }
  }
  (this->super_ChBeamSectionCosserat).elasticity.
  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_90->super_ChElasticityCosserat;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).elasticity.
              super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_28);
  ((this->super_ChBeamSectionCosserat).elasticity.
   super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  section = &this->super_ChBeamSectionCosserat;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x48);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b26158;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(undefined2 *)&this_00[2]._vptr__Sp_counted_base = 0x101;
  *(undefined1 *)((long)&this_00[2]._vptr__Sp_counted_base + 2) = 0;
  local_98 = local_70;
  local_a8 = local_70 * 0.08333333333333333;
  local_a0 = local_68;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChInertiaCosserat_00b25e30;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)(local_68 * local_70);
  dVar2 = pow(local_68,3.0);
  *(double *)&this_00[3]._M_use_count = dVar2 * local_a8;
  local_a8 = local_a0 * 0.08333333333333333;
  dVar2 = pow(local_98,3.0);
  bVar1 = __libc_single_threaded == '\0';
  this_00[4]._vptr__Sp_counted_base = (_func_int **)(dVar2 * local_a8);
  *(double *)&this_00[2]._M_use_count = local_60;
  if (bVar1) {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  (this->super_ChBeamSectionCosserat).inertia.
  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  local_40 = (element_type *)(this_00 + 1);
  local_38._M_pi = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).inertia.
              super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_38);
  ((this->super_ChBeamSectionCosserat).inertia.
   super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->section =
       &this->super_ChBeamSectionCosserat;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  local_80 = (ChBeamSectionShapeRectangular *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChBeamSectionShapeRectangular,std::allocator<chrono::fea::ChBeamSectionShapeRectangular>,double&,double&>
            (&local_78,&local_80,(allocator<chrono::fea::ChBeamSectionShapeRectangular> *)&local_a9,
             &local_68,&local_70);
  local_50 = local_80;
  local_48._M_pi = local_78._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
  }
  (this->super_ChBeamSectionCosserat).super_ChBeamSection.draw_shape.
  super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_80->super_ChBeamSectionShape;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).super_ChBeamSection.draw_shape.
              super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_48);
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  return;
}

Assistant:

ChBeamSectionCosseratEasyRectangular::ChBeamSectionCosseratEasyRectangular(
    double width_y,  // width of section in y direction
    double width_z,  // width of section in z direction
    double E,        // Young modulus
    double G,        // shear modulus
    double density   // volumetric density (ex. in SI units: [kg/m])
) {
    auto melasticity = chrono_types::make_shared<ChElasticityCosseratSimple>();
    melasticity->SetYoungModulus(E);
    melasticity->SetGshearModulus(G);
    melasticity->SetAsRectangularSection(width_y, width_z);
    this->SetElasticity(melasticity);

    auto minertia = chrono_types::make_shared<ChInertiaCosseratSimple>();
    minertia->SetAsRectangularSection(width_y, width_z, density);
    this->SetInertia(minertia);

    auto mdrawshape = chrono_types::make_shared<ChBeamSectionShapeRectangular>(width_y, width_z);
    this->SetDrawShape(mdrawshape);
}